

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

void __thiscall Player::draw(Player *this,int i)

{
  pointer *pppAVar1;
  pointer ppAVar2;
  iterator __position;
  AEntity *tmp;
  AEntity *local_20;
  
  if (0 < i) {
    do {
      ppAVar2 = (this->_deck).super__Vector_base<AEntity_*,_std::allocator<AEntity_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppAVar2 !=
          (this->_deck).super__Vector_base<AEntity_*,_std::allocator<AEntity_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_20 = ppAVar2[-1];
        __position._M_current =
             (this->_hands).super__Vector_base<AEntity_*,_std::allocator<AEntity_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->_hands).super__Vector_base<AEntity_*,_std::allocator<AEntity_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<AEntity*,std::allocator<AEntity*>>::_M_realloc_insert<AEntity*const&>
                    ((vector<AEntity*,std::allocator<AEntity*>> *)this,__position,&local_20);
        }
        else {
          *__position._M_current = local_20;
          pppAVar1 = &(this->_hands).super__Vector_base<AEntity_*,_std::allocator<AEntity_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppAVar1 = *pppAVar1 + 1;
        }
        pppAVar1 = &(this->_deck).super__Vector_base<AEntity_*,_std::allocator<AEntity_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppAVar1 = *pppAVar1 + -1;
      }
      i = i + -1;
    } while (i != 0);
  }
  return;
}

Assistant:

void Player::draw(int i) {
    for (int j = 0; j < i; ++j) {
        if (this->_deck.size()) {
            AEntity *tmp = this->_deck.back();
            this->_hands.push_back(tmp);
            this->_deck.pop_back();
        } else if (this->_deck.size() == 10) {
            AEntity *tmp = this->_deck.back();
            this->_played.push_back(tmp);
            this->_deck.pop_back();
        } else {
            //todo: gestion de la fatigue
        }
    }
}